

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O3

void update_box(j_decompress_ptr cinfo,boxptr boxp)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  short *psVar15;
  
  iVar12 = boxp->c0min;
  iVar13 = boxp->c0max;
  iVar6 = boxp->c1min;
  lVar7 = (long)iVar6;
  iVar4 = boxp->c1max;
  iVar8 = boxp->c2min;
  lVar9 = (long)iVar8;
  iVar5 = boxp->c2max;
  if (iVar12 < iVar13) {
    lVar14 = (long)iVar12;
    do {
      if (iVar6 <= iVar4) {
        lVar3 = (long)&(&cinfo->err)[lVar14]->error_exit + lVar7 * 0x40 + lVar9 * 2;
        lVar11 = lVar7;
        do {
          if (iVar8 <= iVar5) {
            lVar2 = 0;
            do {
              if (*(short *)(lVar3 + lVar2 * 2) != 0) {
                iVar12 = (int)lVar14;
                boxp->c0min = iVar12;
                goto LAB_0027b874;
              }
              lVar2 = lVar2 + 1;
            } while ((iVar5 - iVar8) + 1 != (int)lVar2);
          }
          lVar11 = lVar11 + 1;
          lVar3 = lVar3 + 0x40;
        } while (iVar4 + 1 != (int)lVar11);
      }
      lVar14 = lVar14 + 1;
    } while (iVar13 + 1 != (int)lVar14);
  }
LAB_0027b874:
  if (iVar12 < iVar13) {
    lVar14 = (long)iVar13;
    do {
      if (iVar6 <= iVar4) {
        lVar3 = (long)&(&cinfo->err)[lVar14]->error_exit + lVar7 * 0x40 + lVar9 * 2;
        lVar11 = lVar7;
        do {
          if (iVar8 <= iVar5) {
            lVar2 = 0;
            do {
              if (*(short *)(lVar3 + lVar2 * 2) != 0) {
                iVar13 = (int)lVar14;
                boxp->c0max = iVar13;
                goto LAB_0027b8fd;
              }
              lVar2 = lVar2 + 1;
            } while ((iVar5 - iVar8) + 1 != (int)lVar2);
          }
          lVar11 = lVar11 + 1;
          lVar3 = lVar3 + 0x40;
        } while (iVar4 + 1 != (int)lVar11);
      }
      bVar1 = iVar12 < lVar14;
      lVar14 = lVar14 + -1;
    } while (bVar1);
  }
LAB_0027b8fd:
  if (iVar6 < iVar4) {
    lVar14 = lVar7 * 0x40 + lVar9 * 2;
    do {
      lVar11 = (long)iVar12;
      if (iVar12 <= iVar13) {
        do {
          if (iVar8 <= iVar5) {
            lVar3 = 0;
            do {
              if (*(short *)((long)&(&cinfo->err)[lVar11]->error_exit + lVar3 * 2 + lVar14) != 0) {
                iVar6 = (int)lVar7;
                boxp->c1min = iVar6;
                goto LAB_0027b97a;
              }
              lVar3 = lVar3 + 1;
            } while ((iVar5 - iVar8) + 1 != (int)lVar3);
          }
          lVar11 = lVar11 + 1;
        } while (iVar13 + 1 != (int)lVar11);
      }
      lVar7 = lVar7 + 1;
      lVar14 = lVar14 + 0x40;
    } while (iVar4 + 1 != (int)lVar7);
  }
LAB_0027b97a:
  if (iVar6 < iVar4) {
    lVar7 = (long)iVar4 * 0x40 + lVar9 * 2;
    lVar14 = (long)iVar4;
    do {
      lVar11 = (long)iVar12;
      if (iVar12 <= iVar13) {
        do {
          if (iVar8 <= iVar5) {
            lVar3 = 0;
            do {
              if (*(short *)((long)&(&cinfo->err)[lVar11]->error_exit + lVar3 * 2 + lVar7) != 0) {
                iVar4 = (int)lVar14;
                boxp->c1max = iVar4;
                goto LAB_0027ba04;
              }
              lVar3 = lVar3 + 1;
            } while ((iVar5 - iVar8) + 1 != (int)lVar3);
          }
          lVar11 = lVar11 + 1;
        } while (iVar13 + 1 != (int)lVar11);
      }
      lVar7 = lVar7 + -0x40;
      bVar1 = iVar6 < lVar14;
      lVar14 = lVar14 + -1;
    } while (bVar1);
  }
LAB_0027ba04:
  if (iVar8 < iVar5) {
    do {
      lVar7 = (long)iVar12;
      if (iVar12 <= iVar13) {
        do {
          if (iVar6 <= iVar4) {
            psVar15 = (short *)((long)&(&cinfo->err)[lVar7]->error_exit +
                               lVar9 * 2 + (long)iVar6 * 0x40);
            iVar10 = (iVar4 - iVar6) + 1;
            do {
              if (*psVar15 != 0) {
                iVar8 = (int)lVar9;
                boxp->c2min = iVar8;
                goto LAB_0027ba82;
              }
              psVar15 = psVar15 + 0x20;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar7 = lVar7 + 1;
        } while (iVar13 + 1 != (int)lVar7);
      }
      lVar9 = lVar9 + 1;
    } while (iVar5 + 1 != (int)lVar9);
  }
LAB_0027ba82:
  if (iVar8 < iVar5) {
    lVar7 = (long)iVar5;
    do {
      lVar9 = (long)iVar12;
      if (iVar12 <= iVar13) {
        do {
          if (iVar6 <= iVar4) {
            psVar15 = (short *)((long)&(&cinfo->err)[lVar9]->error_exit +
                               lVar7 * 2 + (long)iVar6 * 0x40);
            iVar10 = (iVar4 - iVar6) + 1;
            do {
              if (*psVar15 != 0) {
                iVar5 = (int)lVar7;
                boxp->c2max = iVar5;
                goto LAB_0027bb06;
              }
              psVar15 = psVar15 + 0x20;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar9 = lVar9 + 1;
        } while (iVar13 + 1 != (int)lVar9);
      }
      bVar1 = iVar8 < lVar7;
      lVar7 = lVar7 + -1;
    } while (bVar1);
  }
LAB_0027bb06:
  lVar7 = (long)((iVar13 - iVar12) * 0x10);
  lVar9 = (long)((iVar4 - iVar6) * 0xc);
  lVar14 = (long)((iVar5 - iVar8) * 8);
  boxp->volume = lVar14 * lVar14 + lVar7 * lVar7 + lVar9 * lVar9;
  if (iVar13 < iVar12) {
    lVar9 = 0;
  }
  else {
    lVar7 = (long)iVar12;
    lVar9 = 0;
    do {
      if (iVar6 <= iVar4) {
        lVar11 = (long)&(&cinfo->err)[lVar7]->error_exit + (long)iVar6 * 0x40 + (long)iVar8 * 2;
        lVar14 = (long)iVar6;
        do {
          if (iVar8 <= iVar5) {
            lVar3 = 0;
            do {
              lVar9 = (lVar9 + 1) - (ulong)(*(short *)(lVar11 + lVar3 * 2) == 0);
              lVar3 = lVar3 + 1;
            } while ((iVar5 - iVar8) + 1 != (int)lVar3);
          }
          lVar14 = lVar14 + 1;
          lVar11 = lVar11 + 0x40;
        } while (iVar4 + 1 != (int)lVar14);
      }
      lVar7 = lVar7 + 1;
    } while (iVar13 + 1 != (int)lVar7);
  }
  boxp->colorcount = lVar9;
  return;
}

Assistant:

LOCAL(void)
update_box (j_decompress_ptr cinfo, boxptr boxp)
/* Shrink the min/max bounds of a box to enclose only nonzero elements, */
/* and recompute its volume and population */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  histptr histp;
  int c0,c1,c2;
  int c0min,c0max,c1min,c1max,c2min,c2max;
  INT32 dist0,dist1,dist2;
  long ccount;
  
  c0min = boxp->c0min;  c0max = boxp->c0max;
  c1min = boxp->c1min;  c1max = boxp->c1max;
  c2min = boxp->c2min;  c2max = boxp->c2max;
  
  if (c0max > c0min)
    for (c0 = c0min; c0 <= c0max; c0++)
      for (c1 = c1min; c1 <= c1max; c1++) {
	histp = & histogram[c0][c1][c2min];
	for (c2 = c2min; c2 <= c2max; c2++)
	  if (*histp++ != 0) {
	    boxp->c0min = c0min = c0;
	    goto have_c0min;
	  }
      }
 have_c0min:
  if (c0max > c0min)
    for (c0 = c0max; c0 >= c0min; c0--)
      for (c1 = c1min; c1 <= c1max; c1++) {
	histp = & histogram[c0][c1][c2min];
	for (c2 = c2min; c2 <= c2max; c2++)
	  if (*histp++ != 0) {
	    boxp->c0max = c0max = c0;
	    goto have_c0max;
	  }
      }
 have_c0max:
  if (c1max > c1min)
    for (c1 = c1min; c1 <= c1max; c1++)
      for (c0 = c0min; c0 <= c0max; c0++) {
	histp = & histogram[c0][c1][c2min];
	for (c2 = c2min; c2 <= c2max; c2++)
	  if (*histp++ != 0) {
	    boxp->c1min = c1min = c1;
	    goto have_c1min;
	  }
      }
 have_c1min:
  if (c1max > c1min)
    for (c1 = c1max; c1 >= c1min; c1--)
      for (c0 = c0min; c0 <= c0max; c0++) {
	histp = & histogram[c0][c1][c2min];
	for (c2 = c2min; c2 <= c2max; c2++)
	  if (*histp++ != 0) {
	    boxp->c1max = c1max = c1;
	    goto have_c1max;
	  }
      }
 have_c1max:
  if (c2max > c2min)
    for (c2 = c2min; c2 <= c2max; c2++)
      for (c0 = c0min; c0 <= c0max; c0++) {
	histp = & histogram[c0][c1min][c2];
	for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
	  if (*histp != 0) {
	    boxp->c2min = c2min = c2;
	    goto have_c2min;
	  }
      }
 have_c2min:
  if (c2max > c2min)
    for (c2 = c2max; c2 >= c2min; c2--)
      for (c0 = c0min; c0 <= c0max; c0++) {
	histp = & histogram[c0][c1min][c2];
	for (c1 = c1min; c1 <= c1max; c1++, histp += HIST_C2_ELEMS)
	  if (*histp != 0) {
	    boxp->c2max = c2max = c2;
	    goto have_c2max;
	  }
      }
 have_c2max:

  /* Update box volume.
   * We use 2-norm rather than real volume here; this biases the method
   * against making long narrow boxes, and it has the side benefit that
   * a box is splittable iff norm > 0.
   * Since the differences are expressed in histogram-cell units,
   * we have to shift back to JSAMPLE units to get consistent distances;
   * after which, we scale according to the selected distance scale factors.
   */
  dist0 = ((c0max - c0min) << C0_SHIFT) * C0_SCALE;
  dist1 = ((c1max - c1min) << C1_SHIFT) * C1_SCALE;
  dist2 = ((c2max - c2min) << C2_SHIFT) * C2_SCALE;
  boxp->volume = dist0*dist0 + dist1*dist1 + dist2*dist2;
  
  /* Now scan remaining volume of box and compute population */
  ccount = 0;
  for (c0 = c0min; c0 <= c0max; c0++)
    for (c1 = c1min; c1 <= c1max; c1++) {
      histp = & histogram[c0][c1][c2min];
      for (c2 = c2min; c2 <= c2max; c2++, histp++)
	if (*histp != 0) {
	  ccount++;
	}
    }
  boxp->colorcount = ccount;
}